

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  uint *puVar1;
  uint uVar2;
  uv__queue *puVar3;
  uv_stdio_container_t *puVar4;
  long lVar5;
  __pid_t __pid;
  uv_loop_t *puVar6;
  int iVar7;
  __pid_t _Var8;
  uint uVar9;
  int (*pipes) [2];
  long *plVar10;
  int *piVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  int (*fds) [2];
  ulong uVar16;
  pid_t pid;
  int exec_errorno;
  int status;
  int pipes_storage [8] [2];
  __pid_t local_a8;
  uint local_a4;
  uv__queue *local_a0;
  uv_loop_t *local_98;
  uv_process_t *local_90;
  ulong local_88;
  int local_80;
  int local_7c;
  int local_78 [18];
  
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 8;
  (process->handle_queue).next = &loop->handle_queue;
  puVar3 = (loop->handle_queue).prev;
  (process->handle_queue).prev = puVar3;
  puVar3->next = &process->handle_queue;
  (loop->handle_queue).prev = &process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  puVar3 = &process->queue;
  (process->queue).next = puVar3;
  (process->queue).prev = puVar3;
  process->status = 0;
  process->pid = 0;
  if ((options->cpumask != (char *)0x0) &&
     (uVar15 = options->cpumask_size, iVar7 = uv_cpumask_size(), uVar15 < (ulong)(long)iVar7)) {
    return -0x16;
  }
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                  ,0x4b1,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if (0xff < options->flags) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_HIDE_CONSOLE | UV_PROCESS_WINDOWS_HIDE_GUI | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                  ,0x4b9,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  uVar14 = options->stdio_count;
  uVar9 = 3;
  if (3 < (int)uVar14) {
    uVar9 = uVar14;
  }
  uVar15 = (ulong)uVar9;
  local_a0 = puVar3;
  local_98 = loop;
  local_90 = process;
  if ((int)uVar14 < 9) {
    pipes = (int (*) [2])local_78;
  }
  else {
    pipes = (int (*) [2])uv__malloc(uVar15 * 8);
  }
  local_88 = uVar15;
  if (pipes != (int (*) [2])0x0) {
    memset(pipes,0xff,uVar15 * 8);
    if (0 < options->stdio_count) {
      lVar12 = 8;
      lVar13 = 0;
      fds = pipes;
      do {
        puVar4 = options->stdio;
        uVar2 = *(uint *)((long)puVar4 + lVar12 + -8);
        uVar14 = uVar2 & 7;
        switch(uVar14) {
        case 0:
          break;
        case 1:
          lVar5 = *(long *)((long)&puVar4->flags + lVar12);
          if (lVar5 == 0) {
            __assert_fail("container->data.stream != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                          ,0xd5,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
          }
          uVar14 = 0xffffffea;
          if (*(int *)(lVar5 + 0x10) == 7) {
            uVar14 = uv_socketpair(1,0,*fds,0,0);
          }
          break;
        case 2:
        case 4:
          plVar10 = (long *)((long)&puVar4->flags + lVar12);
          if ((uVar2 & 2) == 0) {
            plVar10 = (long *)(*plVar10 + 0x98);
          }
          if ((int)*plVar10 == -1) {
            uVar14 = 0xffffffea;
          }
          else {
            (*fds)[1] = (int)*plVar10;
            uVar14 = 0;
          }
          break;
        default:
          __assert_fail("0 && \"Unexpected flags\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                        ,0xe9,"int uv__process_init_stdio(uv_stdio_container_t *, int *)");
        }
        if (uVar14 != 0) goto LAB_001eb42a;
        lVar13 = lVar13 + 1;
        fds = fds + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar13 < options->stdio_count);
    }
    puVar6 = local_98;
    uv_signal_start(&local_98->child_watcher,uv__chld,0x11);
    uv_rwlock_wrlock(&puVar6->cloexec_lock);
    pthread_setcancelstate(1,&local_80);
    local_a4 = 0;
    uVar14 = uv__spawn_and_init_child_fork(options,(int *)&local_a4,uVar9,pipes,&local_a8);
    pthread_setcancelstate(local_80,(int *)0x0);
    uv_rwlock_wrunlock(&puVar6->cloexec_lock);
    __pid = local_a8;
    if ((uVar14 == 0) && (uVar14 = 0, local_a4 != 0)) {
      do {
        _Var8 = waitpid(__pid,&local_7c,0);
        if (_Var8 != -1) break;
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      uVar14 = local_a4;
      if (_Var8 != __pid) {
        __assert_fail("err == *pid",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/process.c"
                      ,0x449,
                      "int uv__spawn_and_init_child(uv_loop_t *, const uv_process_options_t *, int, int (*)[2], pid_t *)"
                     );
      }
    }
    if (uVar14 == 0) {
      local_90->pid = local_a8;
      local_90->exit_cb = options->exit_cb;
      (local_90->queue).next = &puVar6->process_handles;
      puVar3 = (puVar6->process_handles).prev;
      (local_90->queue).prev = puVar3;
      puVar3->next = local_a0;
      (puVar6->process_handles).prev = local_a0;
      uVar9 = local_90->flags;
      if (((uVar9 & 4) == 0) && (local_90->flags = uVar9 | 4, (uVar9 & 8) != 0)) {
        puVar1 = &local_90->loop->active_handles;
        *puVar1 = *puVar1 + 1;
      }
    }
    if (0 < options->stdio_count) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        puVar4 = options->stdio;
        uVar9 = 0;
        if (((*(byte *)((long)&puVar4->flags + lVar12) & 1) != 0) && (-1 < pipes[lVar13][0])) {
          iVar7 = uv__close(pipes[lVar13][1]);
          if (iVar7 != 0) {
            abort();
          }
          pipes[lVar13][1] = -1;
          uv__nonblock_ioctl(pipes[lVar13][0],1);
          uVar9 = *(uint *)((long)&puVar4->flags + lVar12);
          uVar9 = uv__stream_open(*(uv_stream_t **)((long)&puVar4->data + lVar12),pipes[lVar13][0],
                                  (uVar9 & 0x10) << 0xb | (uVar9 & 0x20) << 9);
        }
        if (uVar9 != 0) goto joined_r0x001eb409;
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar13 < options->stdio_count);
    }
    goto LAB_001eb47c;
  }
  uVar14 = 0xfffffff4;
LAB_001eb42a:
  uVar15 = local_88;
  if (pipes == (int (*) [2])0x0) {
    return uVar14;
  }
  uVar16 = 0;
  do {
    if (((long)options->stdio_count <= (long)uVar16) ||
       ((options->stdio[uVar16].flags & (UV_INHERIT_STREAM|UV_INHERIT_FD)) == UV_IGNORE)) {
      if (pipes[uVar16][0] != -1) {
        uv__close_nocheckstdio(pipes[uVar16][0]);
      }
      if (pipes[uVar16][1] != -1) {
        uv__close_nocheckstdio(pipes[uVar16][1]);
      }
    }
    uVar16 = uVar16 + 1;
  } while (uVar16 != uVar15);
LAB_001eb47c:
  if (pipes != (int (*) [2])local_78) {
    uv__free(pipes);
  }
  return uVar14;
joined_r0x001eb409:
  for (; uVar14 = uVar9, lVar12 != 0; lVar12 = lVar12 + -0x10) {
    if ((*(byte *)((long)&options->stdio[-1].flags + lVar12) & 1) != 0) {
      uv__stream_close(*(uv_stream_t **)((long)options->stdio + lVar12 + -8));
    }
  }
  goto LAB_001eb42a;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  uv__queue_init(&process->queue);
  process->status = 0;
  process->pid = 0;
  return UV_ENOSYS;
#else
  int pipes_storage[8][2];
  int (*pipes)[2];
  int stdio_count;
  pid_t pid;
  int exec_errorno;
  int err;
  int i;

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  uv__queue_init(&process->queue);
  process->status = 0;
  process->pid = 0;

  if (options->cpumask != NULL) {
#if defined(__linux__) || defined(__FreeBSD__)
    if (options->cpumask_size < (size_t)uv_cpumask_size())
      return UV_EINVAL;
#else
    return UV_ENOTSUP;
#endif
  }

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_FILE_PATH_EXACT_NAME |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_HIDE_CONSOLE |
                              UV_PROCESS_WINDOWS_HIDE_GUI |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = UV_ENOMEM;
  pipes = pipes_storage;
  if (stdio_count > (int) ARRAY_SIZE(pipes_storage))
    pipes = uv__malloc(stdio_count * sizeof(*pipes));

  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

#ifdef UV_USE_SIGCHLD
  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);
#endif

  /* Spawn the child */
  exec_errorno = uv__spawn_and_init_child(loop, options, stdio_count, pipes, &pid);

#if 0
  /* This runs into a nodejs issue (it expects initialized streams, even if the
   * exec failed).
   * See https://github.com/libuv/libuv/pull/3107#issuecomment-782482608 */
  if (exec_errorno != 0)
      goto error;
#endif

  /* Activate this handle if exec() happened successfully, even if we later
   * fail to open a stdio handle. This ensures we can eventually reap the child
   * with waitpid. */
  if (exec_errorno == 0) {
#ifndef UV_USE_SIGCHLD
    struct kevent event;
    EV_SET(&event, pid, EVFILT_PROC, EV_ADD | EV_ONESHOT, NOTE_EXIT, 0, 0);
    if (kevent(loop->backend_fd, &event, 1, NULL, 0, NULL)) {
      if (errno != ESRCH)
        abort();
      /* Process already exited. Call waitpid on the next loop iteration. */
      process->flags |= UV_HANDLE_REAP;
      loop->flags |= UV_LOOP_REAP_CHILDREN;
    }
    /* This prevents uv__io_poll() from bailing out prematurely, being unaware
     * that we added an event here for it to react to. We will decrement this
     * again after the waitpid call succeeds. */
    loop->nfds++;
#endif

    process->pid = pid;
    process->exit_cb = options->exit_cb;
    uv__queue_insert_tail(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i]);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  if (pipes != pipes_storage)
    uv__free(pipes);

  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }

    if (pipes != pipes_storage)
      uv__free(pipes);
  }

  return err;
#endif
}